

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testC14N.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *local_a0;
  xmlChar **local_90;
  char *local_88;
  xmlChar **local_78;
  char *local_70;
  char *local_60;
  char *local_50;
  char *local_40;
  xmlChar **list_1;
  xmlChar **list;
  int ret;
  char **argv_local;
  int argc_local;
  
  list._4_4_ = -1;
  xmlInitParser();
  xmlCheckVersion(0x33072);
  if (argc < 3) {
    fprintf(_stderr,"Error: wrong number of arguments.\n");
    usage(*argv);
  }
  else {
    iVar1 = strcmp(argv[1],"--with-comments");
    if (iVar1 == 0) {
      if (argc < 4) {
        local_40 = (char *)0x0;
      }
      else {
        local_40 = argv[3];
      }
      list._4_4_ = test_c14n(argv[2],1,0,local_40,(xmlChar **)0x0);
    }
    else {
      iVar1 = strcmp(argv[1],"--without-comments");
      if (iVar1 == 0) {
        if (argc < 4) {
          local_50 = (char *)0x0;
        }
        else {
          local_50 = argv[3];
        }
        list._4_4_ = test_c14n(argv[2],0,0,local_50,(xmlChar **)0x0);
      }
      else {
        iVar1 = strcmp(argv[1],"--1-1-with-comments");
        if (iVar1 == 0) {
          if (argc < 4) {
            local_60 = (char *)0x0;
          }
          else {
            local_60 = argv[3];
          }
          list._4_4_ = test_c14n(argv[2],1,2,local_60,(xmlChar **)0x0);
        }
        else {
          iVar1 = strcmp(argv[1],"--1-1-without-comments");
          if (iVar1 == 0) {
            if (argc < 4) {
              local_70 = (char *)0x0;
            }
            else {
              local_70 = argv[3];
            }
            list._4_4_ = test_c14n(argv[2],0,2,local_70,(xmlChar **)0x0);
          }
          else {
            iVar1 = strcmp(argv[1],"--exc-with-comments");
            if (iVar1 == 0) {
              if (argc < 5) {
                local_78 = (xmlChar **)0x0;
              }
              else {
                local_78 = parse_list((xmlChar *)argv[4]);
              }
              if (argc < 4) {
                local_88 = (char *)0x0;
              }
              else {
                local_88 = argv[3];
              }
              list._4_4_ = test_c14n(argv[2],1,1,local_88,local_78);
              if (local_78 != (xmlChar **)0x0) {
                (*_xmlFree)(local_78);
              }
            }
            else {
              iVar1 = strcmp(argv[1],"--exc-without-comments");
              if (iVar1 == 0) {
                if (argc < 5) {
                  local_90 = (xmlChar **)0x0;
                }
                else {
                  local_90 = parse_list((xmlChar *)argv[4]);
                }
                if (argc < 4) {
                  local_a0 = (char *)0x0;
                }
                else {
                  local_a0 = argv[3];
                }
                list._4_4_ = test_c14n(argv[2],0,1,local_a0,local_90);
                if (local_90 != (xmlChar **)0x0) {
                  (*_xmlFree)(local_90);
                }
              }
              else {
                fprintf(_stderr,"Error: bad option.\n");
                usage(*argv);
              }
            }
          }
        }
      }
    }
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return (uint)(list._4_4_ < 0);
}

Assistant:

int main(int argc, char **argv) {
    int ret = -1;

    /*
     * Init libxml
     */
    xmlInitParser();
    LIBXML_TEST_VERSION

    /*
     * Parse command line and process file
     */
    if( argc < 3 ) {
	fprintf(stderr, "Error: wrong number of arguments.\n");
	usage(argv[0]);
    } else if(strcmp(argv[1], "--with-comments") == 0) {
	ret = test_c14n(argv[2], 1, XML_C14N_1_0, (argc > 3) ? argv[3] : NULL, NULL);
    }